

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  byte bVar1;
  undefined1 auVar2 [16];
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int i;
  long lVar8;
  uint uVar9;
  int iVar10;
  vec4 *c1;
  int x;
  ComputeShaderBase *pCVar11;
  size_type __n;
  int iVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  int local_90;
  Vector<float,_3> local_84;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vec4 *epsilon;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,(long)(height * width),(allocator_type *)&data);
  __n = (size_type)(height * width * 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,__n,(allocator_type *)&local_84);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1908
             ,0x1401,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  pVVar3 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  auVar2 = _DAT_0167ea80;
  for (lVar8 = 0; lVar8 < (long)__n; lVar8 = lVar8 + 4) {
    bVar1 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8 + 2];
    iVar10 = (int)lVar8 >> 2;
    auVar15._0_8_ =
         (double)(*(ushort *)
                   (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar8) & 0xff);
    auVar15._8_8_ =
         (double)(byte)(*(ushort *)
                         (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar8) >> 8);
    auVar15 = divpd(auVar15,auVar2);
    *(ulong *)fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar10].m_data =
         CONCAT44((float)auVar15._8_8_,(float)auVar15._0_8_);
    fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar10].m_data[2] = (float)bVar1 / 255.0;
  }
  fVar14 = (float)width * 0.1 + 1.0;
  fVar13 = (float)height * 0.1 + 1.0;
  iVar10 = (int)fVar13;
  uVar9 = (uint)(((float)width - (fVar14 + fVar14)) + -1.0);
  epsilon = (vec4 *)(ulong)uVar9;
  c1 = &this->g_color_eps;
  local_90 = iVar10 * width + (int)fVar14;
  do {
    lVar8 = (long)(int)fVar14;
    iVar12 = local_90;
    if ((int)(((float)height - (fVar13 + fVar13)) + -1.0) <= iVar10) {
      tcu::Vector<float,_3>::Vector(&local_84,0.0);
      bVar4 = ColorEqual((ComputeShaderBase *)(pVVar3 + (width * 2 + 2)),&local_84,(vec3 *)c1,
                         epsilon);
      pCVar11 = (ComputeShaderBase *)
                (fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (width * 3 + -3));
      tcu::Vector<float,_3>::Vector(&local_84,0.0);
      bVar5 = ColorEqual(pCVar11,&local_84,(vec3 *)c1,epsilon);
      iVar10 = (height + -3) * width;
      pCVar11 = (ComputeShaderBase *)
                (fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (iVar10 + width + -3));
      tcu::Vector<float,_3>::Vector(&local_84,0.0);
      bVar6 = ColorEqual(pCVar11,&local_84,(vec3 *)c1,epsilon);
      tcu::Vector<float,_3>::Vector(&local_84,0.0);
      bVar7 = ColorEqual((ComputeShaderBase *)
                         (fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (iVar10 + 2)),&local_84,
                         (vec3 *)c1,epsilon);
      bVar7 = bVar7 && (bVar6 && (bVar5 && bVar4));
LAB_00c21f37:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base(&fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   );
      return bVar7;
    }
    while (lVar8 < (int)uVar9) {
      bVar4 = ColorEqual((ComputeShaderBase *)(pVVar3 + iVar12),expected,(vec3 *)c1,epsilon);
      lVar8 = lVar8 + 1;
      iVar12 = iVar12 + 1;
      if (!bVar4) {
        bVar7 = false;
        goto LAB_00c21f37;
      }
    }
    iVar10 = iVar10 + 1;
    local_90 = local_90 + width;
  } while( true );
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool				 result = true;
		std::vector<vec3>	fb(width * height);
		std::vector<GLubyte> data(width * height * 4);
		glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < width * height * 4; i += 4)
		{
			fb[i / 4] = vec3(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
							 static_cast<GLfloat>(data[i + 2] / 255.));
		}

		int startx = int((static_cast<float>(width) * 0.1f) + 1);
		int starty = int((static_cast<float>(height) * 0.1f) + 1);
		int endx   = int(static_cast<float>(width) - 2 * ((static_cast<float>(width) * 0.1f) + 1) - 1);
		int endy   = int(static_cast<float>(height) - 2 * ((static_cast<float>(height) * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}